

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O3

void Gia_ManAddDom(Gia_Man_t *p,Gia_Obj_t *pObj,int iDom0)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  
  pGVar3 = p->pObjs;
  if ((pObj < pGVar3) || (iVar1 = p->nObjs, pGVar3 + iVar1 <= pObj)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar5 = (int)((long)pObj - (long)pGVar3 >> 2) * -0x55555555;
  if (-1 < (int)uVar5) {
    uVar2 = p->vDoms->nSize;
    if ((int)uVar5 < (int)uVar2) {
      piVar4 = p->vDoms->pArray;
      uVar7 = piVar4[uVar5 & 0x7fffffff];
      uVar6 = iDom0;
      if (piVar4[uVar5 & 0x7fffffff] != 0xffffffff) {
        do {
          while (uVar6 = uVar5, iDom0 <= (int)uVar7) {
            if ((int)uVar7 <= iDom0) {
              uVar6 = iDom0;
              if (iDom0 != uVar7) {
                __assert_fail("iDom0 == iDom1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                              ,0x50,"void Gia_ManAddDom(Gia_Man_t *, Gia_Obj_t *, int)");
              }
              goto LAB_0057bec7;
            }
            if ((iDom0 < 0) || (iVar1 <= iDom0)) {
LAB_0057bf0c:
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            if ((int)uVar2 <= iDom0) goto LAB_0057beed;
            bVar8 = piVar4[(uint)iDom0] == iDom0;
            iDom0 = piVar4[(uint)iDom0];
            if (bVar8) goto LAB_0057bec7;
          }
          if (((int)uVar7 < 0) || (iVar1 <= (int)uVar7)) goto LAB_0057bf0c;
          if (uVar2 <= uVar7) goto LAB_0057beed;
          bVar8 = piVar4[uVar7] != uVar7;
          uVar7 = piVar4[uVar7];
        } while (bVar8);
      }
LAB_0057bec7:
      piVar4[uVar5 & 0x7fffffff] = uVar6;
      return;
    }
  }
LAB_0057beed:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Gia_ManAddDom( Gia_Man_t * p, Gia_Obj_t * pObj, int iDom0 )
{
    int iDom1, iDomNext;
    if ( Gia_ObjDom(p, pObj) == -1 )
    {
        Gia_ObjSetDom( p, pObj, iDom0 );
        return;
    }
    iDom1 = Gia_ObjDom( p, pObj );
    while ( 1 )
    {
        if ( iDom0 > iDom1 )
        {
            iDomNext = Gia_ObjDom( p, Gia_ManObj(p, iDom1) );
            if ( iDomNext == iDom1 )
                break;
            iDom1 = iDomNext;
            continue;
        }
        if ( iDom1 > iDom0 )
        {
            iDomNext = Gia_ObjDom( p, Gia_ManObj(p, iDom0) );
            if ( iDomNext == iDom0 )
                break;
            iDom0 = iDomNext;
            continue;
        }
        assert( iDom0 == iDom1 );
        Gia_ObjSetDom( p, pObj, iDom0 );
        return;
    }
    Gia_ObjSetDom( p, pObj, Gia_ObjId(p, pObj) );
}